

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valfmt_set.c
# Opt level: O3

int mpt_valfmt_set(mpt_array *arr,mpt_convertable *src)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 *puVar5;
  mpt_value_format fmt;
  mpt_array tmp;
  mpt_iterator *it;
  char *from;
  mpt_value_format local_44;
  mpt_array local_40;
  long *local_38;
  char *local_30;
  
  local_40._buf = (mpt_buffer *)0x0;
  if (src == (mpt_convertable *)0x0) {
    return (uint)(arr->_buf == (mpt_buffer *)0x0) * 4 + -4;
  }
  local_38 = (long *)0x0;
  iVar2 = (*src->_vptr->convert)(src,0x86,&local_38);
  if ((iVar2 < 1) || (local_38 == (long *)0x0)) {
    iVar2 = (*src->_vptr->convert)(src,0x18,&local_44);
    if (iVar2 < 0) {
      local_30 = (char *)0x0;
      iVar2 = (*src->_vptr->convert)(src,0x73,&local_30);
      if (iVar2 < 0) {
        return iVar2;
      }
      if ((iVar2 != 0) && (iVar2 = mpt_valfmt_parse(&local_40,local_30), iVar2 < 0)) {
        return iVar2;
      }
      iVar2 = 0;
    }
    else {
      iVar3 = mpt_valfmt_add(&local_40,local_44);
      iVar2 = 0;
      if (iVar3 < 0) {
        mpt_array_clone(&local_40,(mpt_array *)0x0);
        return iVar3;
      }
    }
  }
  else {
    iVar3 = 0;
    do {
      iVar2 = iVar3;
      puVar5 = (undefined8 *)(**(code **)*local_38)();
      if (puVar5 == (undefined8 *)0x0) break;
      local_44.flags = 0;
      local_44.width = '\0';
      local_44.dec = '\0';
      lVar1 = puVar5[1];
      if (((lVar1 == 0x80) || (lVar1 == 0x801)) || (lVar1 - 0x100U < 0x700)) {
        puVar5 = *(undefined8 **)*puVar5;
        if (puVar5 != (undefined8 *)0x0) {
          (**(code **)*puVar5)(puVar5,0x18,&local_44);
        }
      }
      else if ((lVar1 == 0x18) && ((mpt_value_format *)*puVar5 != (mpt_value_format *)0x0)) {
        local_44 = *(mpt_value_format *)*puVar5;
      }
      iVar3 = mpt_valfmt_add(&local_40,local_44);
      if (iVar3 < 0) {
        return 1;
      }
      iVar4 = (**(code **)(*local_38 + 8))();
      iVar3 = iVar2 + 1;
    } while (0 < iVar4);
  }
  mpt_array_clone(arr,&local_40);
  mpt_array_clone(&local_40,(mpt_array *)0x0);
  return iVar2;
}

Assistant:

extern int mpt_valfmt_set(MPT_STRUCT(array) *arr, MPT_INTERFACE(convertable) *src)
{
	MPT_INTERFACE(iterator) *it;
	MPT_STRUCT(array) tmp = MPT_ARRAY_INIT;
	MPT_STRUCT(value_format) fmt;
	int ret, curr;
	
	if (!src) {
		static const MPT_STRUCT(type_traits) *traits = 0;
		MPT_STRUCT(buffer) *buf;
		if (!(buf = arr->_buf)) {
			return 0;
		}
		/* initialize traits binding */
		if (!traits || (!(traits = mpt_type_traits(MPT_ENUM(TypeValFmt))))) {
			return MPT_ERROR(BadOperation);
		}
		if (!buf) {
			if (!(buf = _mpt_buffer_alloc(0, 0))) {
				return MPT_ERROR(BadOperation);
			}
			buf->_content_traits = traits;
		}
		else if (traits != buf->_content_traits) {
			return MPT_ERROR(BadType);
		}
		else {
			if ((buf = buf->_vptr->detach(buf, 0))) {
				return MPT_ERROR(BadOperation);
			}
			buf->_used = 0;
		}
		return MPT_ENUM(TypeValFmt);
	}
	/* get elements from iterator */
	it = 0;
	if ((ret = src->_vptr->convert(src, MPT_ENUM(TypeIteratorPtr), &it)) > 0
	    && it) {
		ret = 0;
		while (1) {
			static const MPT_STRUCT(value_format) def = MPT_VALFMT_INIT;
			const MPT_STRUCT(value) *val;
			
			if (!(val = it->_vptr->value(it))) {
				break;
			}
			fmt = def;
			if (MPT_type_isConvertable(val->_type)) {
				MPT_INTERFACE(convertable) *elem;
				if ((elem = *((void * const *) val->_addr))) {
					elem->_vptr->convert(elem, MPT_ENUM(TypeValFmt), &fmt);
				}
			}
			else if (val->_type == MPT_ENUM(TypeValFmt) && val->_addr) {
				fmt = *((const MPT_STRUCT(value_format) *) val->_addr);
			}
			if ((curr = mpt_valfmt_add(&tmp, fmt) < 0)) {
				return curr;
			}
			if ((curr = it->_vptr->advance(it) <= 0)) {
				break;
			}
			++ret;
		}
	}
	/* assign single element */
	else if ((ret = src->_vptr->convert(src, MPT_ENUM(TypeValFmt), &fmt)) >= 0) {
		if ((curr = mpt_valfmt_add(&tmp, fmt)) < 0) {
			mpt_array_clone(&tmp, 0);
			return curr;
		}
		ret = 0;
	}
	/* get elements from string value */
	else {
		const char *from = 0;
		if ((ret = src->_vptr->convert(src, 's', &from)) < 0) {
			return ret;
		}
		if (ret && (ret = mpt_valfmt_parse(&tmp, from)) < 0) {
			return ret;
		}
		ret = 0;
	}
	mpt_array_clone(arr, &tmp);
	mpt_array_clone(&tmp, 0);
	return ret;
}